

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_EvaluateQuotientRule3(int dim,int der_count,int v_stride,double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int local_bc;
  int q;
  int Fn;
  int kk;
  int jj;
  int ii;
  int n;
  int k;
  int j;
  int i;
  double *x;
  double *f;
  double wtt;
  double wst;
  double wss;
  double wrt;
  double wrs;
  double wrr;
  double wt;
  double ws;
  double wr;
  double Ft;
  double Fs;
  double Fr;
  double F;
  double *v_local;
  int v_stride_local;
  int der_count_local;
  int dim_local;
  
  dVar13 = v[dim];
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    k = (v_stride * (der_count + 1) * (der_count + 2) * (der_count + 3)) / 6;
    _j = v;
    while (k != 0) {
      *_j = (1.0 / dVar13) * *_j;
      k = k + -1;
      _j = _j + 1;
    }
    if (der_count != 0) {
      _j = v + v_stride;
      dVar13 = -_j[dim];
      dVar14 = -_j[dim + v_stride];
      dVar15 = -_j[dim + v_stride * 2];
      n = dim;
      x = v;
      while (n != 0) {
        dVar16 = *x;
        *_j = dVar13 * dVar16 + *_j;
        _j[v_stride] = dVar14 * dVar16 + _j[v_stride];
        _j[v_stride << 1] = dVar15 * dVar16 + _j[v_stride << 1];
        _j = _j + 1;
        n = n + -1;
        x = x + 1;
      }
      if (1 < der_count) {
        _j = v + (v_stride << 2);
        dVar16 = _j[dim];
        dVar1 = _j[dim + v_stride];
        dVar2 = _j[dim + v_stride * 2];
        dVar3 = _j[dim + v_stride * 3];
        dVar4 = _j[dim + v_stride * 4];
        dVar5 = _j[dim + v_stride * 5];
        n = dim;
        x = v;
        while (n != 0) {
          dVar6 = x[v_stride];
          dVar7 = x[v_stride << 1];
          dVar8 = x[v_stride * 3];
          dVar9 = *x;
          *_j = -dVar16 * dVar9 + dVar13 * 2.0 * dVar6 + *_j;
          _j[v_stride] = dVar14 * dVar6 + -dVar1 * dVar9 + dVar13 * dVar7 + _j[v_stride];
          _j[v_stride << 1] = dVar15 * dVar6 + -dVar2 * dVar9 + dVar13 * dVar8 + _j[v_stride << 1];
          _j[v_stride * 3] = -dVar3 * dVar9 + dVar14 * 2.0 * dVar7 + _j[v_stride * 3];
          _j[v_stride << 2] = dVar15 * dVar7 + -dVar4 * dVar9 + dVar14 * dVar8 + _j[v_stride << 2];
          _j[v_stride * 5] = -dVar5 * dVar9 + dVar15 * 2.0 * dVar8 + _j[v_stride * 5];
          _j = _j + 1;
          n = n + -1;
          x = x + 1;
        }
        if (2 < der_count) {
          x = v + v_stride * 10;
          for (jj = 3; jj <= der_count; jj = jj + 1) {
            for (k = jj; -1 < k; k = k + -1) {
              for (n = jj - k; -1 < n; n = n + -1) {
                iVar10 = (jj - k) - n;
                for (kk = 0; kk <= k; kk = kk + 1) {
                  dVar13 = ON_BinomialCoefficient(kk,k - kk);
                  for (Fn = 0; Fn <= n; Fn = Fn + 1) {
                    dVar14 = ON_BinomialCoefficient(Fn,n - Fn);
                    for (q = (int)(kk == 0 && Fn == 0); q <= iVar10; q = q + 1) {
                      iVar11 = kk + Fn + q;
                      dVar16 = ON_BinomialCoefficient(q,iVar10 - q);
                      dVar15 = v[v_stride *
                                 ((iVar11 * (iVar11 + 1) * (iVar11 + 2)) / 6 +
                                  ((iVar11 - kk) * ((iVar11 - kk) + 1)) / 2 + q) + dim];
                      iVar11 = jj - iVar11;
                      iVar12 = (iVar11 - k) + kk;
                      for (local_bc = 0; local_bc < dim; local_bc = local_bc + 1) {
                        x[local_bc] = -(dVar13 * dVar14) * dVar16 * dVar15 *
                                      v[v_stride *
                                        (((iVar11 * (iVar11 + 1) * (iVar11 + 2)) / 6 +
                                          (iVar12 * (iVar12 + 1)) / 2 + iVar10) - q) + local_bc] +
                                      x[local_bc];
                      }
                    }
                  }
                }
                x = x + v_stride;
              }
            }
          }
        }
      }
    }
    der_count_local._3_1_ = true;
  }
  else {
    der_count_local._3_1_ = false;
  }
  return der_count_local._3_1_;
}

Assistant:

bool ON_EvaluateQuotientRule3( int dim, int der_count, int v_stride, double *v )
{
  double
    F, Fr, Fs, Ft, wr, ws, wt, wrr, wrs, wrt, wss, wst, wtt, *f, *x;
  int
    i, j, k, n;

  // comment notation:
  //   X = value of numerator
  //   W = value of denominator
  //   F = X/W
  //   Xr = partial w.r.t. 1st parameter
  //   Xs = partial w.r.t. 2nd parameter
  //   Xt = partial w.r.t. 3rd parameter 
  //   ...

	// divide everything by the weight
  F = v[dim];
  if (F == 0.0)
    return false;
  F = 1.0/F;
  n = der_count+1;
  i = v_stride*n*(n+1)*(n+2)/6;
  x = v;
  while(i--) 
    *x++ *= F;

  if (der_count) 
  {
		// first derivatives
    f = v;                   // f = F
    x = v + v_stride;        // x = Xr/w, x[v_stride] = Xs/w
    wr = -x[dim];            // wr = -Wr/w
    ws = -x[dim+v_stride];   // ws = -Ws/w
    wt = -x[dim+2*v_stride]; // wt = -Wt/w
    j = dim; 
		while (j--) 
    {
			F = *f++;
			x[0]          += wr*F;
			x[v_stride]   += ws*F;
			x[2*v_stride] += wt*F;
			x++;
		}

    if (der_count> 1) 
    {
      // 2nd derivatives
      f = v;                // f = F, f[v_stride] = Fr, f[2*v_stride] = Fs, f[3*v_stride] = Ft
      x = v + 4*v_stride;   // x = Xrr, x[v_strde] = Xrs, ...
      wrr = -x[dim];
			wrs = -x[dim+v_stride];
			wrt = -x[dim+2*v_stride];
			wss = -x[dim+3*v_stride];
			wst = -x[dim+4*v_stride];
			wtt = -x[dim+5*v_stride];
      j = dim; 
			while(j--) 
      {
				Fr = f[v_stride];
				Fs = f[2*v_stride];
				Ft = f[3*v_stride];
				F = *f++;
				x[0]          += wrr*F + 2.0*wr*Fr;     // Drr
				x[v_stride]   += wrs*F + wr*Fs + ws*Fr; // Drs
				x[2*v_stride] += wrt*F + wr*Ft + wt*Fr; // Drt
				x[3*v_stride] += wss*F + 2.0*ws*Fs;     // Dss
				x[4*v_stride] += wst*F + ws*Ft + wt*Fs; // Dst
				x[5*v_stride] += wtt*F + 2.0*wt*Ft;     // Dtt
				x++;
			}

      if ( der_count > 2 )
      {
        int ii, jj, kk, Fn, q;
        f = v + 10*v_stride; // f = Xrrr
        for ( n = 3; n <= der_count; n++ ) 
        {
          for ( i = n; i >= 0; i-- ) 
          {
            for ( j = n-i; j >= 0; j-- )
            {
              k = n-i-j;
              // f = Dr^i Ds^j Dt^k
              for ( ii = 0; ii <= i; ii++ ) 
              {
                wr = ON_BinomialCoefficient(ii,i-ii);
                for ( jj = 0; jj <= j; jj++ ) 
                {
                  ws = wr*ON_BinomialCoefficient(jj,j-jj);
                  for ( kk = (ii||jj)?0:1; kk <= k; kk++ ) 
                  {
                    q = ii+jj+kk;
                    Fn=q-ii;
                    Fn = v_stride*( q*(q+1)*(q+2)/6  +  Fn*(Fn+1)/2  +  kk )+dim;
                    // wt = -(i choose ii)*(j choose jj)*(k choose kk)*W(ii,jj,kk)
                    wt = -ws*ON_BinomialCoefficient(kk,k-kk)*v[Fn];
                    q = n-q;
                    Fn = q-i+ii;
                    // F(i-ii,j-jj,k-kk) = v[Fn]
                    Fn = v_stride*( q*(q+1)*(q+2)/6  +  Fn*(Fn+1)/2  +  k-kk );
                    for ( q = 0; q < dim; q++ )
                      f[q] += wt*v[Fn+q];
                  }
                }
              }
              f += v_stride;
            }
          }
        }
      }
    }
  }

  return true;
}